

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# networkDataTypes.cpp
# Opt level: O3

bool __thiscall HighFreqDataType::operator==(HighFreqDataType *this,HighFreqDataType *obj)

{
  size_t sVar1;
  int iVar2;
  bool bVar3;
  
  sVar1 = (this->name)._M_string_length;
  if (sVar1 == (obj->name)._M_string_length) {
    if (sVar1 == 0) {
      bVar3 = true;
    }
    else {
      iVar2 = bcmp((this->name)._M_dataplus._M_p,(obj->name)._M_dataplus._M_p,sVar1);
      bVar3 = iVar2 == 0;
    }
  }
  else {
    bVar3 = false;
  }
  sVar1 = (this->origin)._M_string_length;
  if (sVar1 == (obj->origin)._M_string_length) {
    if (sVar1 != 0) {
      iVar2 = bcmp((this->origin)._M_dataplus._M_p,(obj->origin)._M_dataplus._M_p,sVar1);
      if (iVar2 != 0) goto LAB_00178c89;
    }
  }
  else {
LAB_00178c89:
    bVar3 = false;
  }
  sVar1 = (this->sockAddr)._M_string_length;
  if (sVar1 == (obj->sockAddr)._M_string_length) {
    if (sVar1 == 0) goto LAB_00178cad;
    iVar2 = bcmp((this->sockAddr)._M_dataplus._M_p,(obj->sockAddr)._M_dataplus._M_p,sVar1);
    if (iVar2 == 0) goto LAB_00178cad;
  }
  bVar3 = false;
LAB_00178cad:
  return (bool)(this->byteSize == obj->byteSize & bVar3);
}

Assistant:

bool HighFreqDataType::operator ==(const HighFreqDataType &obj) {
    bool retval = true;
    if (name != obj.name)
        retval = false;
    if (origin != obj.origin)
        retval = false;
    if (sockAddr != obj.sockAddr)
        retval = false;
    if (byteSize != obj.byteSize)
        retval = false;

    return(retval);
}